

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeCubeLodFromDerivates
                (LodMode lodMode,Vec3 *coord,Vec3 *coordDx,Vec3 *coordDy,int faceSize)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  CubeFace CVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float dvdy;
  float dudy;
  float dvdx;
  float dudx;
  float mady;
  float tcdy;
  float scdy;
  float madx;
  float tcdx;
  float scdx;
  float ma;
  float tc;
  float sc;
  int tNdx;
  int sNdx;
  int maNdx;
  CubeFace face;
  int faceSize_local;
  Vec3 *coordDy_local;
  Vec3 *coordDx_local;
  Vec3 *coord_local;
  LodMode lodMode_local;
  
  CVar6 = tcu::selectCubeFace(coord);
  tNdx = 0;
  sc = 0.0;
  tc = 0.0;
  if (CVar6 < CUBEFACE_NEGATIVE_Y) {
    tNdx = 0;
    sc = 2.8026e-45;
    tc = 1.4013e-45;
  }
  else if (CVar6 - CUBEFACE_NEGATIVE_Y < 2) {
    tNdx = 1;
    sc = 0.0;
    tc = 2.8026e-45;
  }
  else if (CVar6 - CUBEFACE_NEGATIVE_Z < 2) {
    tNdx = 2;
    sc = 0.0;
    tc = 1.4013e-45;
  }
  pfVar7 = tcu::Vector<float,_3>::operator[](coord,(int)sc);
  fVar11 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coord,(int)tc);
  fVar1 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coord,tNdx);
  fVar8 = de::abs<float>(*pfVar7);
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDx,(int)sc);
  fVar2 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDx,(int)tc);
  fVar3 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDx,tNdx);
  fVar9 = de::abs<float>(*pfVar7);
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDy,(int)sc);
  fVar4 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDy,(int)tc);
  fVar5 = *pfVar7;
  pfVar7 = tcu::Vector<float,_3>::operator[](coordDy,tNdx);
  fVar10 = de::abs<float>(*pfVar7);
  fVar11 = computeLodFromDerivates
                     (lodMode,((float)faceSize * 0.5 * (fVar2 * fVar8 + -(fVar11 * fVar9))) /
                              (fVar8 * fVar8),
                      ((float)faceSize * 0.5 * (fVar3 * fVar8 + -(fVar1 * fVar9))) / (fVar8 * fVar8)
                      ,((float)faceSize * 0.5 * (fVar4 * fVar8 + -(fVar11 * fVar10))) /
                       (fVar8 * fVar8),
                      ((float)faceSize * 0.5 * (fVar5 * fVar8 + -(fVar1 * fVar10))) /
                      (fVar8 * fVar8));
  return fVar11;
}

Assistant:

static float computeCubeLodFromDerivates (LodMode lodMode, const tcu::Vec3& coord, const tcu::Vec3& coordDx, const tcu::Vec3& coordDy, const int faceSize)
{
	const tcu::CubeFace	face	= tcu::selectCubeFace(coord);
	int					maNdx	= 0;
	int					sNdx	= 0;
	int					tNdx	= 0;

	// \note Derivate signs don't matter when computing lod
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X:
		case tcu::CUBEFACE_POSITIVE_X: maNdx = 0; sNdx = 2; tNdx = 1; break;
		case tcu::CUBEFACE_NEGATIVE_Y:
		case tcu::CUBEFACE_POSITIVE_Y: maNdx = 1; sNdx = 0; tNdx = 2; break;
		case tcu::CUBEFACE_NEGATIVE_Z:
		case tcu::CUBEFACE_POSITIVE_Z: maNdx = 2; sNdx = 0; tNdx = 1; break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	{
		const float		sc		= coord[sNdx];
		const float		tc		= coord[tNdx];
		const float		ma		= de::abs(coord[maNdx]);
		const float		scdx	= coordDx[sNdx];
		const float		tcdx	= coordDx[tNdx];
		const float		madx	= de::abs(coordDx[maNdx]);
		const float		scdy	= coordDy[sNdx];
		const float		tcdy	= coordDy[tNdx];
		const float		mady	= de::abs(coordDy[maNdx]);
		const float		dudx	= float(faceSize) * 0.5f * (scdx*ma - sc*madx) / (ma*ma);
		const float		dvdx	= float(faceSize) * 0.5f * (tcdx*ma - tc*madx) / (ma*ma);
		const float		dudy	= float(faceSize) * 0.5f * (scdy*ma - sc*mady) / (ma*ma);
		const float		dvdy	= float(faceSize) * 0.5f * (tcdy*ma - tc*mady) / (ma*ma);

		return computeLodFromDerivates(lodMode, dudx, dvdx, dudy, dvdy);
	}
}